

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O0

int ncnn::deconvolutiondepthwise3d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int kernel_d,int stride_w,int stride_h,int stride_d,int dilation_w,
              int dilation_h,int dilation_d,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  int iVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined4 *puVar3;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  float fVar5;
  float fVar6;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  undefined4 in_stack_00000048;
  long *in_stack_00000050;
  int i_6;
  int size_3;
  float *outptr_3;
  int k_1;
  float val_1;
  int q;
  float *kptr_1;
  float *outptr_2;
  int j_2;
  int i_5;
  int z_2;
  int outd_1;
  int outh_2;
  int outw_2;
  int d_1;
  int h_1;
  int w_2;
  float bias_1;
  float *weight_data_ptr;
  Mat out_1;
  int p;
  int g_1;
  int outch_g;
  int inch_g;
  int i_3;
  int size_1;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  float *outptr;
  int j_1;
  int i_2;
  int z_1;
  int outd;
  int outh_1;
  int outw_1;
  int d;
  int h;
  int w;
  float bias;
  Mat out;
  float *kptr;
  float *inptr;
  int g;
  int j;
  int i;
  int z;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int inch;
  Mat *m_3;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i_4;
  float *ptr_1;
  int size_2;
  int i_1;
  float *ptr;
  int size;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float in_stack_fffffffffffff480;
  float in_stack_fffffffffffff484;
  size_type in_stack_fffffffffffff488;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff490;
  undefined4 local_af0;
  float local_aa4;
  undefined4 local_a60;
  int local_9f0;
  int local_9dc;
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 local_9c8;
  undefined4 local_9c0;
  long local_9b8;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined4 local_9a0;
  undefined8 local_998;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined4 local_978;
  long local_970;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined8 local_950;
  float local_948;
  int local_944;
  long local_940;
  undefined8 local_938;
  undefined8 local_930;
  undefined8 local_928;
  undefined4 local_920;
  long *local_918;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined8 local_8f8;
  long local_8f0;
  int local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  undefined4 local_8c4;
  long local_8c0;
  undefined4 *local_8b8;
  int *local_8b0;
  ulong local_8a8;
  undefined4 local_8a0;
  long *local_898;
  int local_890;
  int local_88c;
  int local_888;
  undefined4 local_884;
  int local_880;
  ulong local_878;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  undefined4 *local_858;
  float local_84c;
  int local_848;
  float local_844;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined4 local_828;
  long *local_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined8 local_800;
  long local_7f8;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  undefined4 local_7cc;
  undefined4 *local_7c8;
  int *local_7c0;
  ulong local_7b8;
  undefined4 local_7b0;
  long *local_7a8;
  int local_7a0;
  int local_79c;
  int local_798;
  undefined4 local_794;
  int local_790;
  ulong local_788;
  long local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined4 local_760;
  long local_758;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined4 local_740;
  undefined8 local_738;
  long local_730;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  int local_710;
  int local_70c;
  reference local_708;
  vector<int,_std::allocator<int>_> local_6e8;
  int local_6cc;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  long *local_6b0;
  long *local_6a8;
  long *local_6a0;
  long *local_698;
  undefined8 *local_690;
  undefined8 *local_680;
  undefined4 **local_670;
  undefined8 *local_660;
  undefined8 *local_650;
  undefined8 *local_640;
  undefined4 **local_630;
  long *local_620;
  long *local_618;
  int local_600;
  undefined4 local_5fc;
  undefined4 **local_5f8;
  undefined8 *local_5d8;
  undefined8 *local_5b8;
  undefined8 *local_598;
  int local_580;
  undefined4 local_57c;
  undefined4 **local_578;
  undefined8 *local_558;
  undefined8 *local_538;
  undefined4 *local_510;
  undefined4 *local_4d0;
  long *local_4c0;
  long *local_4b8;
  undefined1 local_4ad;
  int local_4ac;
  undefined8 *local_4a0;
  undefined1 local_475;
  int local_474;
  undefined8 *local_468;
  long *local_440;
  undefined8 *local_430;
  undefined1 local_425;
  int local_424;
  undefined4 **local_418;
  undefined1 local_3ed;
  int local_3ec;
  undefined4 **local_3e0;
  long local_3b8;
  long *local_3b0;
  long local_3a8;
  long *local_3a0;
  int local_394;
  undefined4 *local_390;
  int local_388;
  undefined4 local_384;
  undefined4 **local_380;
  undefined4 **local_378;
  int local_36c;
  undefined4 *local_368;
  int local_360;
  undefined4 local_35c;
  undefined4 **local_358;
  undefined4 **local_350;
  int local_344;
  undefined4 **local_340;
  undefined8 *local_338;
  int local_32c;
  undefined4 **local_328;
  undefined8 *local_320;
  int local_314;
  undefined8 *local_310;
  int local_304;
  undefined8 *local_300;
  undefined4 **local_2f8;
  undefined4 **local_2f0;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  long *local_2c0;
  float local_2b4 [3];
  long *local_2a8;
  undefined8 local_2a0;
  long *local_298;
  undefined8 local_290;
  long *local_288;
  undefined8 local_280;
  long *local_278;
  undefined8 local_270;
  long *local_268;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  long *local_238;
  float local_22c [3];
  long *local_220;
  undefined8 local_218;
  long *local_210;
  undefined8 local_208;
  long *local_200;
  undefined8 local_1f8;
  long *local_1f0;
  undefined8 local_1e8;
  long *local_1e0;
  int local_1d4;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  int local_1bc;
  undefined8 *local_1b8;
  long *local_1b0;
  undefined4 local_1a4;
  ulong local_1a0;
  undefined4 *local_198;
  int local_18c;
  int local_188;
  int local_184;
  undefined4 **local_180;
  long *local_178;
  undefined4 local_16c;
  ulong local_168;
  undefined4 *local_160;
  int local_154;
  int local_150;
  int local_14c;
  undefined4 **local_148;
  long local_140;
  undefined4 local_134;
  long local_130;
  long local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  long local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  long *local_60;
  undefined4 local_54;
  ulong local_50;
  undefined4 *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  long *local_30;
  undefined4 local_24;
  ulong local_20;
  undefined4 *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_6bc = (int)in_RDI[7];
  local_6c0 = *(int *)((long)in_RSI + 0x2c);
  local_6c4 = (int)in_RSI[6];
  local_6c8 = (int)in_RSI[7];
  local_6cc = in_R8D * in_R9D * in_stack_00000008;
  local_6b8 = in_R9D;
  local_6b4 = in_R8D;
  local_6b0 = in_RCX;
  local_6a8 = in_RDX;
  local_6a0 = in_RSI;
  local_698 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x1d97d05);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  std::allocator<int>::~allocator((allocator<int> *)0x1d97d31);
  local_708 = std::vector<int,_std::allocator<int>_>::operator[](&local_6e8,0);
  local_70c = 0;
  local_710 = 0;
  local_714 = local_6c0 * in_stack_00000030 - local_6b4 * in_stack_00000028;
  local_718 = local_6c4 * local_6c0 * in_stack_00000038 - local_6c0 * local_6b8 * in_stack_00000030;
  for (local_71c = 0; local_71c < in_stack_00000008; local_71c = local_71c + 1) {
    for (local_720 = 0; local_720 < local_6b8; local_720 = local_720 + 1) {
      for (local_724 = 0; local_724 < local_6b4; local_724 = local_724 + 1) {
        local_708[local_70c] = local_710;
        local_70c = local_70c + 1;
        local_710 = in_stack_00000028 + local_710;
      }
      local_710 = local_714 + local_710;
    }
    local_710 = local_718 + local_710;
  }
  if ((local_6bc == in_stack_00000040) && (in_stack_00000040 == local_6c8)) {
    for (local_728 = 0; local_728 < in_stack_00000040; local_728 = local_728 + 1) {
      local_468 = &local_778;
      local_114 = *(int *)((long)local_698 + 0x2c);
      local_118 = (int)local_698[6];
      local_11c = *(undefined4 *)((long)local_698 + 0x34);
      local_730 = *local_698 + local_698[8] * (long)local_728 * local_698[2];
      local_130 = local_698[2];
      local_134 = (undefined4)local_698[3];
      local_140 = local_698[4];
      local_110 = &local_778;
      local_b8 = (long)local_114 * (long)local_118 * local_130;
      local_430 = &local_778;
      local_690 = &local_778;
      local_bc = 0x10;
      local_474 = local_728;
      local_475 = 1;
      local_778 = 0;
      local_768 = 0;
      local_760 = 0;
      local_74c = 0;
      local_748 = 0;
      local_744 = 0;
      local_740 = 0;
      local_770 = 0;
      local_780 = *local_6a8 + (long)(local_6cc * local_728) * 4;
      local_3e0 = &local_7c8;
      local_184 = *(int *)((long)local_6a0 + 0x2c);
      local_188 = (int)local_6a0[6];
      local_18c = *(int *)((long)local_6a0 + 0x34);
      local_858 = (undefined4 *)(*local_6a0 + local_6a0[8] * (long)local_728 * local_6a0[2]);
      local_1a0 = local_6a0[2];
      local_1a4 = (undefined4)local_6a0[3];
      local_1b0 = (long *)local_6a0[4];
      local_180 = &local_7c8;
      local_7c0 = (int *)0x0;
      local_794 = 1;
      local_98 = (long)local_184 * (long)local_188 * local_1a0;
      local_788 = (local_98 + 0xfU & 0xfffffffffffffff0) / local_1a0;
      local_7a0 = (int)local_6a0[5] + -1;
      if ((int)local_6a0[5] == 4) {
        local_788 = (long)*(int *)((long)local_6a0 + 0x2c) * (long)(int)local_6a0[6];
      }
      local_9c = 0x10;
      local_3ec = local_728;
      local_3ed = 1;
      local_738 = 0;
      local_750 = 0;
      local_618 = local_6b0;
      bVar4 = true;
      if (*local_6b0 != 0) {
        local_4c0 = local_6b0;
        bVar4 = local_6b0[8] * (long)(int)local_6b0[7] == 0;
      }
      if (bVar4) {
        local_a60 = 0;
      }
      else {
        local_3a8 = (long)local_728;
        local_3a0 = local_6b0;
        local_a60 = *(undefined4 *)(*local_6b0 + local_3a8 * 4);
      }
      local_7cc = local_a60;
      local_358 = &local_7c8;
      local_35c = local_a60;
      local_360 = (int)local_788 * local_18c;
      local_368 = local_858;
      for (local_36c = 0; local_36c < local_360; local_36c = local_36c + 1) {
        *local_368 = local_a60;
        local_368 = local_368 + 1;
      }
      local_7d0 = *(int *)((long)local_698 + 0x2c);
      local_7d4 = (int)local_698[6];
      local_7d8 = *(int *)((long)local_698 + 0x34);
      local_7dc = *(int *)((long)local_6a0 + 0x2c);
      local_7e0 = (int)local_6a0[6];
      local_7e4 = *(int *)((long)local_6a0 + 0x34);
      for (local_7e8 = 0; local_7e8 < local_7d8; local_7e8 = local_7e8 + 1) {
        for (local_7ec = 0; local_7ec < local_7d4; local_7ec = local_7ec + 1) {
          for (local_7f0 = 0; local_7f0 < local_7d0; local_7f0 = local_7f0 + 1) {
            local_32c = local_7e8 * in_stack_00000020;
            local_320 = &local_840;
            local_328 = &local_7c8;
            local_48 = (undefined4 *)
                       ((long)local_858 +
                       (long)local_184 * (long)local_188 * (long)local_32c * local_1a0);
            local_38 = &local_840;
            local_304 = local_7ec * in_stack_00000018;
            local_300 = &local_840;
            local_7f8 = (long)local_48 +
                        (long)(local_7f0 * in_stack_00000010) * 4 +
                        (long)local_184 * (long)local_304 * local_1a0;
            local_680 = &local_840;
            local_840 = 0;
            local_830 = 0;
            local_828 = 0;
            local_818 = 0;
            local_814 = 0;
            local_810 = 0;
            local_80c = 0;
            local_808 = 0;
            local_800 = 0;
            local_838 = 0;
            local_844 = *(float *)(local_730 +
                                  (long)(local_7e8 * local_7d0 * local_7d4 + local_7ec * local_7d0 +
                                        local_7f0) * 4);
            for (local_848 = 0; local_848 < local_6cc; local_848 = local_848 + 1) {
              local_84c = *(float *)(local_780 + (long)local_848 * 4);
              *(float *)(local_7f8 + (long)local_708[local_848] * 4) =
                   local_844 * local_84c + *(float *)(local_7f8 + (long)local_708[local_848] * 4);
            }
            local_558 = local_680;
            local_60 = local_1b0;
            local_54 = local_1a4;
            local_50 = local_1a0;
            local_40 = local_188;
            local_3c = local_184;
            local_820 = local_1b0;
          }
        }
      }
      local_2f0 = &local_7c8;
      local_85c = local_7dc * local_7e0 * local_7e4;
      local_538 = local_690;
      local_350 = local_358;
      local_198 = local_858;
      local_128 = local_730;
      local_7c8 = local_858;
      local_7b8 = local_1a0;
      local_7b0 = local_1a4;
      local_7a8 = local_1b0;
      local_79c = local_184;
      local_798 = local_188;
      local_790 = local_18c;
      local_758 = local_140;
      for (local_860 = 0; local_860 < local_85c; local_860 = local_860 + 1) {
        local_aa4 = (float)local_858[local_860];
        local_238 = in_stack_00000050;
        local_22c[0] = local_aa4;
        switch(in_stack_00000048) {
        case 1:
          if (local_aa4 <= 0.0) {
            local_22c[0] = 0.0;
          }
          break;
        case 2:
          local_1e0 = in_stack_00000050;
          local_1e8 = 0;
          local_23c = *(float *)*in_stack_00000050;
          if (local_aa4 <= 0.0) {
            local_aa4 = local_aa4 * local_23c;
          }
          local_22c[0] = local_aa4;
          break;
        case 3:
          local_1f0 = in_stack_00000050;
          local_1f8 = 0;
          local_240 = *(float *)*in_stack_00000050;
          local_200 = in_stack_00000050;
          local_208 = 1;
          local_244 = *(float *)(*in_stack_00000050 + 4);
          if (local_aa4 < local_240) {
            local_22c[0] = local_240;
          }
          if (local_244 < local_22c[0]) {
            local_22c[0] = local_244;
          }
          break;
        case 4:
          local_248 = 88.37626;
          pfVar2 = std::min<float>(local_22c,&local_248);
          local_22c[0] = *pfVar2;
          local_24c = -88.37626;
          pfVar2 = std::max<float>(local_22c,&local_24c);
          local_22c[0] = *pfVar2;
          fVar5 = expf(-local_22c[0]);
          local_22c[0] = 1.0 / (fVar5 + 1.0);
          break;
        case 5:
          fVar5 = expf(local_aa4);
          fVar5 = logf(fVar5 + 1.0);
          local_22c[0] = tanhf(fVar5);
          local_22c[0] = local_aa4 * local_22c[0];
          break;
        case 6:
          local_210 = in_stack_00000050;
          local_218 = 0;
          local_250 = *(float *)*in_stack_00000050;
          local_220 = in_stack_00000050;
          local_22c[1] = 1.4013e-45;
          local_22c[2] = 0.0;
          local_254 = *(float *)(*in_stack_00000050 + 4);
          local_258 = -local_254 / local_250;
          local_25c = 1.0 / local_250 + local_258;
          if (local_258 <= local_aa4) {
            if (local_aa4 <= local_25c) {
              local_22c[0] = local_aa4 * (local_aa4 * local_250 + local_254);
            }
          }
          else {
            local_22c[0] = 0.0;
          }
        }
        local_858[local_860] = local_22c[0];
      }
      local_670 = &local_7c8;
      local_578 = local_670;
      if (local_7c0 != (int *)0x0) {
        local_57c = 0xffffffff;
        LOCK();
        local_580 = *local_7c0;
        *local_7c0 = *local_7c0 + -1;
        UNLOCK();
        if (local_580 == 1) {
          if (local_7a8 == (long *)0x0) {
            local_510 = local_7c8;
            if (local_7c8 != (undefined4 *)0x0) {
              free(local_7c8);
            }
          }
          else {
            (**(code **)(*local_7a8 + 0x18))(local_7a8,local_7c8);
          }
        }
      }
      local_7c8 = (undefined4 *)0x0;
      local_7b8 = 0;
      local_7b0 = 0;
      local_7a0 = 0;
      local_79c = 0;
      local_798 = 0;
      local_794 = 0;
      local_790 = 0;
      local_788 = 0;
      local_7c0 = (int *)0x0;
    }
  }
  else {
    local_864 = local_6bc / in_stack_00000040;
    local_868 = local_6c8 / in_stack_00000040;
    for (local_86c = 0; local_86c < in_stack_00000040; local_86c = local_86c + 1) {
      for (local_870 = 0; local_870 < local_868; local_870 = local_870 + 1) {
        local_424 = local_86c * local_868 + local_870;
        local_418 = &local_8b8;
        local_14c = *(int *)((long)local_6a0 + 0x2c);
        local_150 = (int)local_6a0[6];
        local_154 = *(int *)((long)local_6a0 + 0x34);
        puVar3 = (undefined4 *)(*local_6a0 + local_6a0[8] * (long)local_424 * local_6a0[2]);
        local_168 = local_6a0[2];
        local_16c = (undefined4)local_6a0[3];
        local_178 = (long *)local_6a0[4];
        local_148 = &local_8b8;
        local_8b0 = (int *)0x0;
        local_884 = 1;
        local_a8 = (long)local_14c * (long)local_150 * local_168;
        local_878 = (local_a8 + 0xfU & 0xfffffffffffffff0) / local_168;
        local_890 = (int)local_6a0[5] + -1;
        if ((int)local_6a0[5] == 4) {
          local_878 = (long)*(int *)((long)local_6a0 + 0x2c) * (long)(int)local_6a0[6];
        }
        local_ac = 0x10;
        local_425 = 1;
        local_440 = local_6a8;
        local_8c0 = *local_6a8 + (long)(local_6cc * local_864 * local_868 * local_86c) * 4;
        local_620 = local_6b0;
        bVar4 = true;
        if (*local_6b0 != 0) {
          local_4b8 = local_6b0;
          bVar4 = local_6b0[8] * (long)(int)local_6b0[7] == 0;
        }
        if (bVar4) {
          local_af0 = 0;
        }
        else {
          local_3b8 = (long)(local_86c * local_868 + local_870);
          local_3b0 = local_6b0;
          local_af0 = *(undefined4 *)(*local_6b0 + local_3b8 * 4);
        }
        local_8c4 = local_af0;
        local_380 = &local_8b8;
        local_384 = local_af0;
        local_388 = (int)local_878 * local_154;
        local_390 = puVar3;
        for (local_394 = 0; local_394 < local_388; local_394 = local_394 + 1) {
          *local_390 = local_af0;
          local_390 = local_390 + 1;
        }
        local_8c8 = *(int *)((long)local_698 + 0x2c);
        local_8cc = (int)local_698[6];
        local_8d0 = *(int *)((long)local_698 + 0x34);
        local_8d4 = *(int *)((long)local_6a0 + 0x2c);
        local_8d8 = (int)local_6a0[6];
        local_8dc = *(int *)((long)local_6a0 + 0x34);
        for (local_8e0 = 0; local_8e0 < local_8d0; local_8e0 = local_8e0 + 1) {
          for (local_8e4 = 0; local_8e4 < local_8cc; local_8e4 = local_8e4 + 1) {
            for (local_8e8 = 0; local_8e8 < local_8c8; local_8e8 = local_8e8 + 1) {
              local_344 = local_8e0 * in_stack_00000020;
              local_338 = &local_938;
              local_340 = &local_8b8;
              local_18 = (undefined4 *)
                         ((long)puVar3 +
                         (long)local_14c * (long)local_150 * (long)local_344 * local_168);
              local_8 = &local_938;
              local_314 = local_8e4 * in_stack_00000018;
              local_310 = &local_938;
              local_8f0 = (long)local_18 +
                          (long)(local_8e8 * in_stack_00000010) * 4 +
                          (long)local_14c * (long)local_314 * local_168;
              local_660 = &local_938;
              local_938 = 0;
              local_928 = 0;
              local_920 = 0;
              local_910 = 0;
              local_90c = 0;
              local_908 = 0;
              local_904 = 0;
              local_900 = 0;
              local_8f8 = 0;
              local_930 = 0;
              local_940 = local_8c0 + (long)(local_6cc * local_864 * local_870) * 4;
              for (local_944 = 0; local_944 < local_864; local_944 = local_944 + 1) {
                local_4ac = local_864 * local_86c + local_944;
                local_4a0 = &local_9d8;
                local_dc = *(int *)((long)local_698 + 0x2c);
                local_e0 = (int)local_698[6];
                local_e4 = *(undefined4 *)((long)local_698 + 0x34);
                local_f0 = *local_698 + local_698[8] * (long)local_4ac * local_698[2];
                local_f8 = local_698[2];
                local_fc = (undefined4)local_698[3];
                local_108 = local_698[4];
                local_d8 = &local_9d8;
                local_c8 = (long)local_dc * (long)local_e0 * local_f8;
                local_1c8 = &local_990;
                local_1d0 = &local_9d8;
                local_78 = local_f0 + (long)local_dc * (long)local_e0 * (long)local_8e0 * local_f8;
                local_68 = &local_990;
                local_1b8 = &local_990;
                local_948 = *(float *)(local_78 + (long)local_dc * (long)local_8e4 * local_f8 +
                                      (long)local_8e8 * 4);
                local_650 = &local_990;
                local_cc = 0x10;
                local_1bc = local_8e4;
                local_1d4 = local_8e0;
                local_4ad = 1;
                local_990 = 0;
                local_980 = 0;
                local_978 = 0;
                local_968 = 0;
                local_964 = 0;
                local_960 = 0;
                local_95c = 0;
                local_958 = 0;
                local_950 = 0;
                local_988 = 0;
                local_640 = &local_9d8;
                local_9d8 = 0;
                local_9c8 = 0;
                local_9c0 = 0;
                local_9b0 = 0;
                local_9ac = 0;
                local_9a8 = 0;
                local_9a4 = 0;
                local_9a0 = 0;
                local_998 = 0;
                local_9d0 = 0;
                for (local_9dc = 0; local_9dc < local_6cc; local_9dc = local_9dc + 1) {
                  *(float *)(local_8f0 + (long)local_708[local_9dc] * 4) =
                       local_948 * *(float *)(local_940 + (long)local_9dc * 4) +
                       *(float *)(local_8f0 + (long)local_708[local_9dc] * 4);
                }
                local_940 = local_940 + (long)local_6cc * 4;
                local_5d8 = local_640;
                local_5b8 = local_650;
                local_90 = local_108;
                local_84 = local_fc;
                local_80 = local_f8;
                local_70 = local_e0;
                local_6c = local_dc;
                local_9b8 = local_108;
                local_970 = local_108;
              }
              local_598 = local_660;
              local_30 = local_178;
              local_24 = local_16c;
              local_20 = local_168;
              local_10 = local_150;
              local_c = local_14c;
              local_918 = local_178;
            }
          }
        }
        local_2f8 = &local_8b8;
        iVar1 = local_8d4 * local_8d8 * local_8dc;
        local_378 = local_380;
        local_160 = puVar3;
        local_8b8 = puVar3;
        local_8a8 = local_168;
        local_8a0 = local_16c;
        local_898 = local_178;
        local_88c = local_14c;
        local_888 = local_150;
        local_880 = local_154;
        for (local_9f0 = 0; local_9f0 < iVar1; local_9f0 = local_9f0 + 1) {
          fVar5 = (float)puVar3[local_9f0];
          local_2c0 = in_stack_00000050;
          local_2b4[0] = fVar5;
          switch(in_stack_00000048) {
          case 1:
            if (fVar5 <= 0.0) {
              local_2b4[0] = 0.0;
            }
            break;
          case 2:
            local_268 = in_stack_00000050;
            local_270 = 0;
            local_2c4 = *(float *)*in_stack_00000050;
            in_stack_fffffffffffff484 = fVar5;
            if (fVar5 <= 0.0) {
              in_stack_fffffffffffff484 = fVar5 * local_2c4;
              local_2b4[0] = fVar5 * local_2c4;
            }
            break;
          case 3:
            local_278 = in_stack_00000050;
            local_280 = 0;
            local_2c8 = *(float *)*in_stack_00000050;
            local_288 = in_stack_00000050;
            local_290 = 1;
            local_2cc = *(float *)(*in_stack_00000050 + 4);
            if (fVar5 < local_2c8) {
              local_2b4[0] = local_2c8;
            }
            if (local_2cc < local_2b4[0]) {
              local_2b4[0] = local_2cc;
            }
            break;
          case 4:
            local_2d0 = 88.37626;
            pfVar2 = std::min<float>(local_2b4,&local_2d0);
            local_2b4[0] = *pfVar2;
            local_2d4 = -88.37626;
            pfVar2 = std::max<float>(local_2b4,&local_2d4);
            local_2b4[0] = *pfVar2;
            fVar5 = expf(-local_2b4[0]);
            local_2b4[0] = 1.0 / (fVar5 + 1.0);
            break;
          case 5:
            fVar6 = expf(fVar5);
            fVar6 = logf(fVar6 + 1.0);
            fVar6 = tanhf(fVar6);
            in_stack_fffffffffffff480 = fVar5;
            local_2b4[0] = fVar5 * fVar6;
            break;
          case 6:
            local_298 = in_stack_00000050;
            local_2a0 = 0;
            local_2d8 = *(float *)*in_stack_00000050;
            local_2a8 = in_stack_00000050;
            local_2b4[1] = 1.4013e-45;
            local_2b4[2] = 0.0;
            local_2dc = *(float *)(*in_stack_00000050 + 4);
            local_2e0 = -local_2dc / local_2d8;
            local_2e4 = 1.0 / local_2d8 + local_2e0;
            if (local_2e0 <= fVar5) {
              if (fVar5 <= local_2e4) {
                local_2b4[0] = fVar5 * (fVar5 * local_2d8 + local_2dc);
              }
            }
            else {
              local_2b4[0] = 0.0;
            }
          }
          puVar3[local_9f0] = local_2b4[0];
        }
        local_630 = &local_8b8;
        local_5f8 = local_630;
        if (local_8b0 != (int *)0x0) {
          local_5fc = 0xffffffff;
          LOCK();
          local_600 = *local_8b0;
          *local_8b0 = *local_8b0 + -1;
          UNLOCK();
          if (local_600 == 1) {
            if (local_898 == (long *)0x0) {
              local_4d0 = local_8b8;
              if (local_8b8 != (undefined4 *)0x0) {
                free(local_8b8);
              }
            }
            else {
              (**(code **)(*local_898 + 0x18))(local_898,local_8b8);
            }
          }
        }
        local_8b8 = (undefined4 *)0x0;
        local_8a8 = 0;
        local_8a0 = 0;
        local_890 = 0;
        local_88c = 0;
        local_888 = 0;
        local_884 = 0;
        local_880 = 0;
        local_878 = 0;
        local_8b0 = (int *)0x0;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
  return 0;
}

Assistant:

static int deconvolutiondepthwise3d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int kernel_d, int stride_w, int stride_h, int stride_d, int dilation_w, int dilation_h, int dilation_d, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = outw * dilation_h - kernel_w * dilation_w;
        int gap1 = outh * outw * dilation_d - outw * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat out = top_blob.channel(g);

            const float bias = bias_data.empty() ? 0.f : bias_data[g];

            out.fill(bias);

            // shadowed variable for less openmp task args
            const int w = bottom_blob.w;
            const int h = bottom_blob.h;
            const int d = bottom_blob.d;
            const int outw = top_blob.w;
            const int outh = top_blob.h;
            const int outd = top_blob.d;

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        const float val = inptr[z * w * h + i * w + j];

                        for (int k = 0; k < maxk; k++)
                        {
                            float w = kptr[k];
                            outptr[space_ofs[k]] += val * w;
                        }
                    }
                }
            }

            {
                float* outptr = out;
                int size = outw * outh * outd;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                Mat out = top_blob.channel(g * outch_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                const float bias = bias_data.empty() ? 0.f : bias_data[g * outch_g + p];

                out.fill(bias);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int d = bottom_blob.d;
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;

                for (int z = 0; z < d; z++)
                {
                    for (int i = 0; i < h; i++)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            float* outptr = out.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            const float* kptr = weight_data_ptr + maxk * inch_g * p;

                            for (int q = 0; q < inch_g; q++)
                            {
                                const float val = bottom_blob.channel(inch_g * g + q).depth(z).row(i)[j];

                                for (int k = 0; k < maxk; k++)
                                {
                                    outptr[space_ofs[k]] += val * kptr[k];
                                }

                                kptr += maxk;
                            }
                        }
                    }
                }

                {
                    float* outptr = out;
                    int size = outw * outh * outd;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}